

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::process_cmdline(QApplicationPrivate *this)

{
  bool bVar1;
  int iVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  char *arg;
  int j;
  int i;
  QLatin1StringView in_stack_ffffffffffffff50;
  QLatin1StringView in_stack_ffffffffffffff60;
  char *local_90;
  int local_88;
  int local_84;
  storage_type *local_70;
  undefined1 local_60 [24];
  storage_type *local_48;
  undefined1 local_38 [24];
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x2c8316);
  if (bVar1) {
    qEnvironmentVariable(local_20);
    QString::operator=((QString *)in_stack_ffffffffffffff50.m_size,in_RDI);
    QString::~QString((QString *)0x2c8351);
  }
  if (((qt_is_tty_app & 1) == 0) && (*(int *)in_RDI[5].d.ptr != 0)) {
    local_88 = 1;
    for (local_84 = 1; local_84 < *(int *)in_RDI[5].d.ptr; local_84 = local_84 + 1) {
      if (*(long *)(in_RDI[5].d.size + (long)local_84 * 8) != 0) {
        if (**(char **)(in_RDI[5].d.size + (long)local_84 * 8) == '-') {
          local_90 = *(char **)(in_RDI[5].d.size + (long)local_84 * 8);
          if (local_90[1] == '-') {
            local_90 = local_90 + 1;
          }
          iVar2 = strcmp(local_90,"-qdevel");
          if ((iVar2 != 0) && (iVar2 = strcmp(local_90,"-qdebug"), iVar2 != 0)) {
            iVar2 = strcmp(local_90,"-stylesheet");
            if ((iVar2 == 0) && (local_84 < *(int *)in_RDI[5].d.ptr + -1)) {
              in_stack_ffffffffffffff60 =
                   Qt::Literals::StringLiterals::operator____L1
                             (in_stack_ffffffffffffff50.m_data,in_stack_ffffffffffffff50.m_size);
              QString::operator=(&styleSheet,(QLatin1String *)in_stack_ffffffffffffff60.m_size);
              local_84 = local_84 + 1;
              QByteArrayView::QByteArrayView<char_*,_true>
                        ((QByteArrayView *)in_stack_ffffffffffffff60.m_size,
                         (char **)in_stack_ffffffffffffff50.m_data);
              QVar3.m_data = local_48;
              QVar3.m_size = (qsizetype)local_38;
              QString::fromLocal8Bit(QVar3);
              QString::append((QString *)&styleSheet);
              QString::~QString((QString *)0x2c8543);
            }
            else {
              iVar2 = strncmp(local_90,"-stylesheet=",0xc);
              if (iVar2 == 0) {
                in_stack_ffffffffffffff50 =
                     Qt::Literals::StringLiterals::operator____L1
                               (in_stack_ffffffffffffff50.m_data,in_stack_ffffffffffffff50.m_size);
                QString::operator=(&styleSheet,(QLatin1String *)in_stack_ffffffffffffff50.m_size);
                QByteArrayView::QByteArrayView<const_char_*,_true>
                          ((QByteArrayView *)in_stack_ffffffffffffff60.m_size,
                           (char **)in_stack_ffffffffffffff50.m_data);
                QVar4.m_data = local_70;
                QVar4.m_size = (qsizetype)local_60;
                QString::fromLocal8Bit(QVar4);
                QString::append((QString *)&styleSheet);
                QString::~QString((QString *)0x2c85e0);
              }
              else {
                iVar2 = qstrcmp(local_90,"-widgetcount");
                if (iVar2 == 0) {
                  widgetCount = true;
                }
                else {
                  *(undefined8 *)(in_RDI[5].d.size + (long)local_88 * 8) =
                       *(undefined8 *)(in_RDI[5].d.size + (long)local_84 * 8);
                  local_88 = local_88 + 1;
                }
              }
            }
          }
        }
        else {
          *(undefined8 *)(in_RDI[5].d.size + (long)local_88 * 8) =
               *(undefined8 *)(in_RDI[5].d.size + (long)local_84 * 8);
          local_88 = local_88 + 1;
        }
      }
    }
    if (local_88 < *(int *)in_RDI[5].d.ptr) {
      *(undefined8 *)(in_RDI[5].d.size + (long)local_88 * 8) = 0;
      *(int *)in_RDI[5].d.ptr = local_88;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::process_cmdline()
{
    if (styleOverride.isEmpty())
        styleOverride = qEnvironmentVariable("QT_STYLE_OVERRIDE");

    // process platform-indep command line
    if (qt_is_tty_app || !argc)
        return;

    int i, j;

    j = 1;
    for (i=1; i<argc; i++) { // if you add anything here, modify QCoreApplication::arguments()
        if (!argv[i])
            continue;
        if (*argv[i] != '-') {
            argv[j++] = argv[i];
            continue;
        }
        const char *arg = argv[i];
        if (arg[1] == '-') // startsWith("--")
            ++arg;
        if (strcmp(arg, "-qdevel") == 0 || strcmp(arg, "-qdebug") == 0) {
            // obsolete argument
#ifndef QT_NO_STYLE_STYLESHEET
        } else if (strcmp(arg, "-stylesheet") == 0 && i < argc -1) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(argv[++i]));
        } else if (strncmp(arg, "-stylesheet=", 12) == 0) {
            styleSheet = "file:///"_L1;
            styleSheet.append(QString::fromLocal8Bit(arg + 12));
#endif
        } else if (qstrcmp(arg, "-widgetcount") == 0) {
            widgetCount = true;
        } else {
            argv[j++] = argv[i];
        }
    }

    if (j < argc) {
        argv[j] = nullptr;
        argc = j;
    }
}